

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteMulti(FILE *pFile,int nVars)

{
  uint uVar1;
  uint uVar2;
  int nDigits2;
  int nDigits;
  int k;
  int i;
  int nVars_local;
  FILE *pFile_local;
  
  uVar1 = Abc_Base10Log(nVars);
  uVar2 = Abc_Base10Log(nVars << 1);
  if (0 < nVars) {
    fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
    fprintf((FILE *)pFile,".inputs");
    for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
      fprintf((FILE *)pFile," a%0*d",(ulong)uVar1,(ulong)(uint)nDigits);
    }
    for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
      fprintf((FILE *)pFile," b%0*d",(ulong)uVar1,(ulong)(uint)nDigits);
    }
    fprintf((FILE *)pFile,"\n");
    fprintf((FILE *)pFile,".outputs");
    for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0; nDigits = nDigits + 1
        ) {
      fprintf((FILE *)pFile," m%0*d",(ulong)uVar2,(ulong)(uint)nDigits);
    }
    fprintf((FILE *)pFile,"\n");
    for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0; nDigits = nDigits + 1
        ) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d\n",(ulong)uVar1,0,(ulong)uVar2,(ulong)(uint)nDigits);
    }
    for (nDigits2 = 0; nDigits2 < nVars; nDigits2 = nDigits2 + 1) {
      for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0;
          nDigits = nDigits + 1) {
        if ((nDigits < nDigits2) || (nDigits2 + nVars <= nDigits)) {
          fprintf((FILE *)pFile,".names y%0*d_%0*d\n",(ulong)uVar1,(ulong)(uint)nDigits2,
                  (ulong)uVar2,(ulong)(uint)nDigits);
        }
        else {
          fprintf((FILE *)pFile,".names b%0*d a%0*d y%0*d_%0*d\n11 1\n",(ulong)uVar1,
                  (ulong)(uint)nDigits2,(ulong)uVar1,(ulong)(uint)(nDigits - nDigits2),uVar1,
                  nDigits2,uVar2,nDigits);
        }
      }
      fprintf((FILE *)pFile,".subckt ADD%d",(ulong)(uint)(nVars << 1));
      for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0;
          nDigits = nDigits + 1) {
        fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",(ulong)uVar2,(ulong)(uint)nDigits,(ulong)uVar1,
                (ulong)(uint)nDigits2,uVar2,nDigits);
      }
      for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0;
          nDigits = nDigits + 1) {
        fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",(ulong)uVar2,(ulong)(uint)nDigits,(ulong)uVar1,
                (ulong)(uint)nDigits2,uVar2,nDigits);
      }
      nDigits = 0;
      while( true ) {
        if (nDigits != nVars * 2 && SBORROW4(nDigits,nVars * 2) == nDigits + nVars * -2 < 0) break;
        fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",(ulong)uVar2,(ulong)(uint)nDigits,(ulong)uVar1,
                (ulong)(nDigits2 + 1),uVar2,nDigits);
        nDigits = nDigits + 1;
      }
      fprintf((FILE *)pFile,"\n");
    }
    for (nDigits = 0; SBORROW4(nDigits,nVars * 2) != nDigits + nVars * -2 < 0; nDigits = nDigits + 1
        ) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",(ulong)uVar1,(ulong)(uint)nDigits2,
              (ulong)uVar2,(ulong)(uint)nDigits,uVar2,nDigits);
    }
    fprintf((FILE *)pFile,".end\n");
    fprintf((FILE *)pFile,"\n");
    Abc_WriteAdder(pFile,nVars << 1);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcGen.c"
                ,0x8f,"void Abc_WriteMulti(FILE *, int)");
}

Assistant:

void Abc_WriteMulti( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < nVars; k++ )
    {
        for ( i = 0; i < 2 * nVars; i++ )
            if ( i >= k && i < k + nVars )
                fprintf( pFile, ".names b%0*d a%0*d y%0*d_%0*d\n11 1\n", nDigits, k, nDigits, i-k, nDigits, k, nDigits2, i );
            else
                fprintf( pFile, ".names y%0*d_%0*d\n", nDigits, k, nDigits2, i );
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}